

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void flatbuffers::ForAllFields
               (Object *object,bool reverse,function<void_(const_reflection::Field_*)> *func)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  Object *pOVar5;
  long lVar6;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Object *local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_58,
             (ulong)*(uint *)(object + (ulong)*(uint *)(object + *(ushort *)
                                                                  (object + (6 - (long)*(int *)
                                                  object))) +
                                       (ulong)*(ushort *)(object + (6 - (long)*(int *)object))));
  uVar1 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object));
  uVar7 = (ulong)*(uint *)(object + uVar1);
  if (*(int *)(object + uVar7 + uVar1) != 0) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      if (*(uint *)(object + uVar7 + uVar1) <= uVar4) goto LAB_001491db;
      lVar6 = (ulong)*(uint *)(object + (ulong)uVar3 + uVar7 + uVar1 + 4) +
              (ulong)uVar3 + uVar7 + uVar1;
      pOVar5 = object + lVar6 + 4;
      if ((*(ushort *)(pOVar5 + -(long)*(int *)pOVar5) < 9) ||
         ((ulong)*(ushort *)(object + ((lVar6 + 0xc) - (long)*(int *)pOVar5)) == 0)) {
        uVar1 = 0;
      }
      else {
        uVar1 = (ulong)*(ushort *)
                        (pOVar5 + *(ushort *)(object + ((lVar6 + 0xc) - (long)*(int *)pOVar5)));
      }
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = (uint)uVar4;
      uVar4 = uVar4 + 1;
      uVar1 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object));
      uVar7 = (ulong)*(uint *)(object + uVar1);
      uVar3 = uVar3 + 4;
    } while (uVar4 < *(uint *)(object + uVar7 + uVar1));
  }
  if ((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar1 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar6 = 1;
    uVar7 = 0;
    do {
      if ((*(ushort *)(object + -(long)*(int *)object) < 7) ||
         (uVar4 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object)), uVar4 == 0)) {
        pOVar5 = (Object *)0x0;
      }
      else {
        pOVar5 = object + *(uint *)(object + uVar4) + uVar4;
      }
      uVar1 = uVar1 + lVar6;
      if (!reverse) {
        uVar1 = uVar7;
      }
      if (*(uint *)pOVar5 <=
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1]) {
LAB_001491db:
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,
                      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
                     );
      }
      uVar1 = (ulong)(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar1] << 2);
      local_38 = pOVar5 + *(uint *)(pOVar5 + uVar1 + 4) + uVar1 + 4;
      if (*(long *)(func + 0x10) == 0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar2);
      }
      (**(code **)(func + 0x18))(func,&local_38);
      uVar7 = uVar7 + 1;
      uVar1 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      lVar6 = lVar6 + -1;
    } while (uVar7 < uVar1);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                  std::function<void(const reflection::Field *)> func) {
  std::vector<uint32_t> field_to_id_map;
  field_to_id_map.resize(object->fields()->size());

  // Create the mapping of field ID to the index into the vector.
  for (uint32_t i = 0; i < object->fields()->size(); ++i) {
    auto field = object->fields()->Get(i);
    field_to_id_map[field->id()] = i;
  }

  for (size_t i = 0; i < field_to_id_map.size(); ++i) {
    func(object->fields()->Get(
        field_to_id_map[reverse ? field_to_id_map.size() - i + 1 : i]));
  }
}